

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  LookasideSlot *pLVar5;
  int iVar6;
  LookasideSlot *pLVar7;
  u32 uVar8;
  ulong uVar9;
  u64 n;
  uint uVar10;
  bool bVar11;
  
  iVar1 = sqlite3LookasideUsed(db,(int *)0x0);
  if (0 < iVar1) {
    return 5;
  }
  if ((db->lookaside).bMalloced != '\0') {
    sqlite3_free((db->lookaside).pStart);
  }
  uVar2 = sz & 0xfffffff8;
  uVar10 = 0xfff8;
  if (uVar2 < 0xfff8) {
    uVar10 = uVar2;
  }
  iVar1 = 0;
  uVar4 = (ulong)uVar10;
  if ((int)uVar2 < 9) {
    uVar4 = 0;
  }
  uVar9 = (ulong)(uint)cnt;
  if (cnt < 1) {
    uVar9 = 0;
  }
  if ((int)uVar4 == 0 || cnt < 1) {
    pLVar5 = (LookasideSlot *)0x0;
    uVar10 = 0;
    iVar3 = 0;
  }
  else {
    n = uVar9 * uVar4;
    pLVar5 = (LookasideSlot *)pBuf;
    if (pBuf == (void *)0x0) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pLVar5 = (LookasideSlot *)sqlite3Malloc(n);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pLVar5 == (LookasideSlot *)0x0) {
        pLVar5 = (LookasideSlot *)0x0;
      }
      else {
        iVar3 = (*sqlite3Config.m.xSize)(pLVar5);
        n = (u64)iVar3;
      }
    }
    if ((uint)sz < 0x180) {
      if ((uint)sz < 0x100) {
        iVar3 = (int)((long)n / (long)(ulong)uVar10);
        goto LAB_0012a016;
      }
      uVar2 = uVar10 + 0x80;
    }
    else {
      uVar2 = uVar10 + 0x180;
    }
    iVar3 = (int)((long)n / (long)(ulong)uVar2);
    iVar1 = (int)((long)(n - (long)iVar3 * (ulong)uVar10) / 0x80);
  }
LAB_0012a016:
  (db->lookaside).pStart = pLVar5;
  (db->lookaside).pInit = (LookasideSlot *)0x0;
  (db->lookaside).pFree = (LookasideSlot *)0x0;
  (db->lookaside).sz = (u16)uVar10;
  (db->lookaside).szTrue = (u16)uVar10;
  if (pLVar5 == (LookasideSlot *)0x0) {
    (db->lookaside).pMiddle = (void *)0x0;
    (db->lookaside).pStart = (void *)0x0;
    (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
    (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
    (db->lookaside).pEnd = (void *)0x0;
    (db->lookaside).bDisable = 1;
    (db->lookaside).sz = 0;
    (db->lookaside).bMalloced = '\0';
    uVar8 = 0;
    pLVar5 = (LookasideSlot *)0x0;
  }
  else {
    pLVar7 = (LookasideSlot *)0x0;
    iVar6 = 0;
    if (0 < iVar3) {
      iVar6 = iVar3;
    }
    while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
      pLVar5->pNext = pLVar7;
      (db->lookaside).pInit = pLVar5;
      pLVar7 = pLVar5;
      pLVar5 = (LookasideSlot *)((long)&pLVar5->pNext + (ulong)uVar10);
    }
    (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
    (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
    (db->lookaside).pMiddle = pLVar5;
    pLVar7 = (LookasideSlot *)0x0;
    iVar6 = 0;
    if (0 < iVar1) {
      iVar6 = iVar1;
    }
    while (bVar11 = iVar6 != 0, iVar6 = iVar6 + -1, bVar11) {
      pLVar5->pNext = pLVar7;
      (db->lookaside).pSmallInit = pLVar5;
      pLVar7 = pLVar5;
      pLVar5 = pLVar5 + 0x10;
    }
    (db->lookaside).pEnd = pLVar5;
    (db->lookaside).bDisable = 0;
    (db->lookaside).bMalloced = pBuf == (void *)0x0;
    uVar8 = iVar1 + iVar3;
  }
  (db->lookaside).nSlot = uVar8;
  (db->lookaside).pTrueEnd = pLVar5;
  return 0;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  sqlite3_int64 szAlloc;
  int nBig;   /* Number of full-size slots */
  int nSm;    /* Number smaller LOOKASIDE_SMALL-byte slots */

  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( sz>65528 ) sz = 65528;
  if( cnt<0 ) cnt = 0;
  szAlloc = (i64)sz*(i64)cnt;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( szAlloc );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) szAlloc = sqlite3MallocSize(pStart);
  }else{
    pStart = pBuf;
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( sz>=LOOKASIDE_SMALL*3 ){
    nBig = szAlloc/(3*LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - (i64)sz*(i64)nBig)/LOOKASIDE_SMALL;
  }else if( sz>=LOOKASIDE_SMALL*2 ){
    nBig = szAlloc/(LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - (i64)sz*(i64)nBig)/LOOKASIDE_SMALL;
  }else
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( sz>0 ){
    nBig = szAlloc/sz;
    nSm = 0;
  }else{
    nBig = nSm = 0;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  db->lookaside.szTrue = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=0; i<nBig; i++){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = p;
    for(i=0; i<nSm; i++){
      p->pNext = db->lookaside.pSmallInit;
      db->lookaside.pSmallInit = p;
      p = (LookasideSlot*)&((u8*)p)[LOOKASIDE_SMALL];
    }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    assert( ((uptr)p)<=szAlloc + (uptr)pStart );
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
    db->lookaside.nSlot = nBig+nSm;
  }else{
    db->lookaside.pStart = 0;
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = 0;
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    db->lookaside.pEnd = 0;
    db->lookaside.bDisable = 1;
    db->lookaside.sz = 0;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
  db->lookaside.pTrueEnd = db->lookaside.pEnd;
  assert( sqlite3LookasideUsed(db,0)==0 );
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}